

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

DBGPROP_ATTRIB_FLAGS __thiscall
Js::RecyclableObjectDisplay::GetTypeAttribute(RecyclableObjectDisplay *this)

{
  JavascriptString *pJVar1;
  Var pvVar2;
  ScriptContext *scriptContext;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  JavascriptString *pJVar7;
  undefined4 *puVar8;
  RecyclableObject *pRVar9;
  uint uVar10;
  Type TVar11;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 local_58 [8];
  EnterScriptObject __enterScriptObject;
  
  uVar10 = this->defaultAttributes;
  bVar4 = VarIs<Js::RecyclableObject>(this->instance);
  if (bVar4) {
    pJVar1 = (JavascriptString *)this->instance;
    pJVar7 = JavascriptLibrary::GetDebuggerDeadZoneBlockVariableString
                       ((this->scriptContext->super_ScriptContextBase).javascriptLibrary);
    if (pJVar1 == pJVar7) {
      uVar10 = uVar10 | 8;
      goto LAB_008c32ff;
    }
    pvVar2 = this->instance;
    if (pvVar2 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_008c33be;
      *puVar8 = 0;
    }
    if (((ulong)pvVar2 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar2 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_008c33be;
      *puVar8 = 0;
    }
    TVar11 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar2 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar11 = TypeIds_Number, (ulong)pvVar2 >> 0x32 == 0)) {
      pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
      if (pRVar9 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_008c33be;
        *puVar8 = 0;
      }
      TVar11 = ((pRVar9->type).ptr)->typeId;
      if ((0x57 < (int)TVar11) && (BVar5 = RecyclableObject::IsExternal(pRVar9), BVar5 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) goto LAB_008c33be;
        *puVar8 = 0;
      }
    }
    if (TVar11 == TypeIds_Function) {
      uVar10 = uVar10 | 0x100;
      goto LAB_008c32ff;
    }
    pvVar2 = this->instance;
    if (pvVar2 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_008c33be;
      *puVar8 = 0;
    }
    if (((ulong)pvVar2 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar2 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_008c33be;
      *puVar8 = 0;
    }
    TVar11 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar2 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar11 = TypeIds_Number, (ulong)pvVar2 >> 0x32 == 0)) {
      pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
      if (pRVar9 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_008c33be;
        *puVar8 = 0;
      }
      TVar11 = ((pRVar9->type).ptr)->typeId;
      if ((0x57 < (int)TVar11) && (BVar5 = RecyclableObject::IsExternal(pRVar9), BVar5 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) goto LAB_008c33be;
        *puVar8 = 0;
      }
    }
    if (TVar11 != TypeIds_String) {
      pvVar2 = this->instance;
      if (pvVar2 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_008c33be;
        *puVar8 = 0;
      }
      if (((ulong)pvVar2 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)pvVar2 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar4) goto LAB_008c33be;
        *puVar8 = 0;
      }
      TVar11 = TypeIds_FirstNumberType;
      if ((((ulong)pvVar2 & 0xffff000000000000) != 0x1000000000000) &&
         (TVar11 = TypeIds_Number, (ulong)pvVar2 >> 0x32 == 0)) {
        pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
        if (pRVar9 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_008c33be;
          *puVar8 = 0;
        }
        TVar11 = ((pRVar9->type).ptr)->typeId;
        if ((0x57 < (int)TVar11) && (BVar5 = RecyclableObject::IsExternal(pRVar9), BVar5 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar4) {
LAB_008c33be:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar8 = 0;
        }
      }
      if (TVar11 != TypeIds_StringObject) goto LAB_008c32ff;
    }
    uVar10 = uVar10 | 0x400;
  }
LAB_008c32ff:
  scriptContext = this->scriptContext;
  if (scriptContext->threadContext->isScriptActive == false) {
    __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
    __entryExitRecord.scriptContext = (ScriptContext *)0x0;
    __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
    __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
    auStack_98 = (undefined1  [8])0x0;
    __entryExitRecord._0_1_ = 0;
    __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
    __entryExitRecord._2_6_ = 0;
    __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
    EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_58,scriptContext,(ScriptEntryExitRecord *)auStack_98,
               unaff_retaddr,&stack0x00000000,false,false,false);
    ScriptContext::OnScriptStart(scriptContext,false,true);
    EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_58);
    if (this->pObjAddress != (IDiagObjectAddress *)0x0) {
      iVar6 = (*this->pObjAddress->_vptr_IDiagObjectAddress[1])();
      if (iVar6 == 0) {
        uVar10 = uVar10 | 0x800;
      }
    }
    EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_58);
  }
  else if (this->pObjAddress != (IDiagObjectAddress *)0x0) {
    iVar6 = (*this->pObjAddress->_vptr_IDiagObjectAddress[1])();
    if (iVar6 == 0) {
      uVar10 = uVar10 | 0x800;
    }
  }
  return uVar10;
}

Assistant:

DBGPROP_ATTRIB_FLAGS RecyclableObjectDisplay::GetTypeAttribute()
    {
        DBGPROP_ATTRIB_FLAGS flag = defaultAttributes;

        if (Js::VarIs<Js::RecyclableObject>(instance))
        {
            if (instance == scriptContext->GetLibrary()->GetDebuggerDeadZoneBlockVariableString())
            {
                flag |= DBGPROP_ATTRIB_VALUE_IS_INVALID;
            }
            else if (JavascriptOperators::GetTypeId(instance) == TypeIds_Function)
            {
                flag |= DBGPROP_ATTRIB_VALUE_IS_METHOD;
            }
            else if (JavascriptOperators::GetTypeId(instance) == TypeIds_String
                || JavascriptOperators::GetTypeId(instance) == TypeIds_StringObject)
            {
                flag |= DBGPROP_ATTRIB_VALUE_IS_RAW_STRING;
            }
        }

        auto checkWriteableFunction = [&]()
        {
            if (pObjAddress && !pObjAddress->IsWritable())
            {
                flag |= DBGPROP_ATTRIB_VALUE_READONLY;
            }
        };

        if (!scriptContext->GetThreadContext()->IsScriptActive())
        {
            BEGIN_JS_RUNTIME_CALL_EX(scriptContext, false);
            {
                IGNORE_STACKWALK_EXCEPTION(scriptContext);
                checkWriteableFunction();
            }
            END_JS_RUNTIME_CALL(scriptContext);
        }
        else
        {
            checkWriteableFunction();
        }
        // TODO : need to identify Events explicitly for fastDOM

        return flag;
    }